

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<128U,_2U,_buffer_layout_bfs>::operator()
          (fill<128U,_2U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  unsigned_long *puVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  unsigned_long uVar7;
  long lVar8;
  uchar *__s2;
  unsigned_long uVar9;
  long lVar10;
  DI __d;
  size_t local_70;
  fill<128U,_4U,_buffer_layout_bfs> local_54;
  fill<128U,_5U,_buffer_layout_bfs> local_53;
  fill<128U,_5U,_buffer_layout_bfs> local_52;
  fill<128U,_4U,_buffer_layout_bfs> local_51;
  size_t local_50;
  unsigned_long *local_48;
  array<Stream,_128UL> *local_40;
  DI local_38;
  
  local_40 = streams;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fill_inner",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", inner, I=",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 4;
  local_48 = buffer_count->_M_elems + 5;
  local_50 = 0;
  local_70 = 0;
  do {
    uVar7 = *puVar1;
    if (uVar7 == 0) {
      fill<128U,_4U,_buffer_layout_bfs>::operator()(&local_51,local_40,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"left stream drained\n",0x14);
        lVar8 = -0x40 - local_50;
        lVar10 = 8 - local_70;
        uVar7 = *local_48;
        goto LAB_0015d4ed;
      }
    }
    uVar9 = *local_48;
    if (uVar9 == 0) {
      fill<128U,_5U,_buffer_layout_bfs>::operator()(&local_52,local_40,buffer,buffer_count);
      uVar9 = *local_48;
      if (uVar9 == 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"right stream drained\n",0x15);
        local_50 = -local_50;
        local_70 = -local_70;
        uVar7 = *puVar1;
        goto LAB_0015d5e0;
      }
      uVar7 = *puVar1;
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"L:\'",3);
    puVar2 = buffer[-uVar7 + 0x50];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar6 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', R:\'",6);
    puVar2 = buffer[-uVar9 + 0x90];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar6 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    puVar2 = buffer[-uVar7 + 0x50];
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[-uVar9 + 0x90];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar2,(char *)__s2);
    puVar3 = local_48;
    if (iVar4 < 1) {
      __s2 = puVar2;
      puVar3 = puVar1;
    }
    *puVar3 = *puVar3 - 1;
    buffer[local_70] = __s2;
    check_input(buffer,local_70);
    local_70 = local_70 + 1;
    local_50 = local_50 - 8;
  } while (local_70 != 8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Done, buffer filled\n",0x14);
  buffer_count->_M_elems[2] = 8;
  goto LAB_0015d760;
LAB_0015d4ed:
  do {
    if (uVar7 == 0) {
      fill<128U,_5U,_buffer_layout_bfs>::operator()(&local_53,local_40,buffer,buffer_count);
      uVar7 = *local_48;
      if (uVar7 == 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"both streams prematurely drained\n",0x21);
        memmove(buffer + lVar10,buffer,lVar8 + 0x40);
        buffer_count->_M_elems[2] = local_70;
        check_input((uchar **)((long)buffer - lVar8),local_70);
        goto LAB_0015d760;
      }
    }
    buffer[local_70] = buffer[0x90 - uVar7];
    uVar7 = uVar7 - 1;
    *local_48 = uVar7;
    lVar10 = lVar10 + -1;
    local_70 = local_70 + 1;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tbuffer filled\n",0xf);
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
  goto LAB_0015d760;
LAB_0015d5e0:
  do {
    if (uVar7 == 0) {
      fill<128U,_4U,_buffer_layout_bfs>::operator()(&local_54,local_40,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"both streams prematurely drained\n",0x21);
        lVar8 = 0x40 - local_50;
        memmove(buffer + local_70 + 8,buffer,local_50);
        buffer_count->_M_elems[2] = -local_70;
        check_input((uchar **)((long)buffer + lVar8),-local_70);
        goto LAB_0015d760;
      }
    }
    *(uchar **)((long)buffer + local_50) = buffer[0x50 - uVar7];
    uVar7 = uVar7 - 1;
    *puVar1 = uVar7;
    local_70 = local_70 + -1;
    local_50 = local_50 + 8;
  } while (local_50 != 0x40);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"buffer filled\n",0xe);
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
LAB_0015d760:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}